

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__resample_row_h_2(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  stbi_uc sVar1;
  ulong uVar2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  
  sVar1 = *in_near;
  if (w == 1) {
    out[1] = sVar1;
    *out = sVar1;
    return out;
  }
  *out = sVar1;
  out[1] = (stbi_uc)((uint)*in_near + (uint)*in_near * 2 + (uint)in_near[1] + 2 >> 2);
  uVar3 = w - 1;
  uVar2 = 2;
  if (2 < w) {
    pbVar4 = in_near + 2;
    uVar2 = 2;
    do {
      iVar5 = (uint)pbVar4[-1] + (uint)pbVar4[-1] * 2;
      out[uVar2] = (stbi_uc)((uint)pbVar4[-2] + iVar5 + 2 >> 2);
      out[uVar2 + 1] = (stbi_uc)(iVar5 + (uint)*pbVar4 + 2 >> 2);
      pbVar4 = pbVar4 + 1;
      uVar2 = uVar2 + 2;
    } while ((ulong)uVar3 * 2 != uVar2);
  }
  out[uVar2 & 0xffffffff] =
       (stbi_uc)((uint)in_near[(long)w + -2] + (uint)in_near[(long)w + -2] * 2 +
                 (uint)in_near[(int)uVar3] + 2 >> 2);
  out[(uVar2 & 0xffffffff) + 1] = in_near[(int)uVar3];
  return out;
}

Assistant:

static stbi_uc *stbi__resample_row_h_2(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
    // need to generate two samples horizontally for every one in input
    int i;
    stbi_uc *input = in_near;

    if (w == 1)
    {
        // if only one sample, can't do any interpolation
        out[0] = out[1] = input[0];
        return out;
    }

    out[0] = input[0];
    out[1] = stbi__div4(input[0] * 3 + input[1] + 2);
    for (i = 1; i < w - 1; ++i)
    {
        int n = 3 * input[i] + 2;
        out[i * 2 + 0] = stbi__div4(n + input[i - 1]);
        out[i * 2 + 1] = stbi__div4(n + input[i + 1]);
    }
    out[i * 2 + 0] = stbi__div4(input[w - 2] * 3 + input[w - 1] + 2);
    out[i * 2 + 1] = input[w - 1];

    STBI_NOTUSED(in_far);
    STBI_NOTUSED(hs);

    return out;
}